

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_setlist(FuncState *fs,int base,int nelems,int tostore)

{
  int B;
  
  B = 0;
  if (tostore != -1) {
    B = tostore;
  }
  if (nelems < 0x400) {
    luaK_codevABCk(fs,OP_SETLIST,base,B,nelems,0);
  }
  else {
    luaK_codevABCk(fs,OP_SETLIST,base,B,nelems & 0x3ff,1);
    codeextraarg(fs,(uint)nelems >> 10);
  }
  fs->freereg = (char)base + '\x01';
  return;
}

Assistant:

void luaK_setlist (FuncState *fs, int base, int nelems, int tostore) {
  lua_assert(tostore != 0);
  if (tostore == LUA_MULTRET)
    tostore = 0;
  if (nelems <= MAXARG_vC)
    luaK_codevABCk(fs, OP_SETLIST, base, tostore, nelems, 0);
  else {
    int extra = nelems / (MAXARG_vC + 1);
    nelems %= (MAXARG_vC + 1);
    luaK_codevABCk(fs, OP_SETLIST, base, tostore, nelems, 1);
    codeextraarg(fs, extra);
  }
  fs->freereg = cast_byte(base + 1);  /* free registers with list values */
}